

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

void rhash_md5_final(md5_ctx *ctx,uchar *result)

{
  undefined8 uVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  
  uVar2 = (uint)ctx->length;
  bVar4 = (byte)(uVar2 << 3);
  uVar2 = uVar2 >> 2 & 0xf;
  ctx->message[uVar2] = 0x80 << (bVar4 & 0x1f) ^ ~(-1 << (bVar4 & 0x1f)) & ctx->message[uVar2];
  if (uVar2 < 0xe) {
    uVar2 = uVar2 + 1;
  }
  else {
    if (uVar2 == 0xe) {
      ctx->message[0xf] = 0;
    }
    rhash_md5_process_block(ctx->hash,ctx->message);
    uVar2 = 0;
  }
  for (uVar3 = (ulong)uVar2; uVar3 < 0xe; uVar3 = uVar3 + 1) {
    ctx->message[uVar3] = 0;
  }
  uVar3 = ctx->length;
  ctx->message[0xe] = (int)uVar3 * 8;
  ctx->message[0xf] = (uint)(uVar3 >> 0x1d);
  rhash_md5_process_block(ctx->hash,ctx->message);
  if (result != (uchar *)0x0) {
    uVar1 = *(undefined8 *)(ctx->hash + 2);
    *(undefined8 *)result = *(undefined8 *)ctx->hash;
    *(undefined8 *)(result + 8) = uVar1;
  }
  return;
}

Assistant:

void rhash_md5_final(md5_ctx* ctx, unsigned char* result)
{
	unsigned index = ((unsigned)ctx->length & 63) >> 2;
	unsigned shift = ((unsigned)ctx->length & 3) * 8;

	/* pad message and run for last block */

	/* append the byte 0x80 to the message */
	ctx->message[index]   &= ~(0xFFFFFFFFu << shift);
	ctx->message[index++] ^= 0x80u << shift;

	/* if no room left in the message to store 64-bit message length */
	if (index > 14) {
		/* then fill the rest with zeros and process it */
		while (index < 16) {
			ctx->message[index++] = 0;
		}
		rhash_md5_process_block(ctx->hash, ctx->message);
		index = 0;
	}
	while (index < 14) {
		ctx->message[index++] = 0;
	}
	ctx->message[14] = (unsigned)(ctx->length << 3);
	ctx->message[15] = (unsigned)(ctx->length >> 29);
	rhash_md5_process_block(ctx->hash, ctx->message);

	if (result) le32_copy(result, 0, &ctx->hash, 16);
}